

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_flag_function
          (App *this,string *name,function<void_(unsigned_long)> *function,string *description)

{
  Option *pOVar1;
  IncorrectConstruction *__return_storage_ptr__;
  string sStack_e8;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_c8;
  string local_a8;
  callback_t fun;
  string local_68;
  function<void_(unsigned_long)> local_48;
  
  std::function<void_(unsigned_long)>::function(&local_48,function);
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_flag_function(std::__cxx11::string,std::function<void(unsigned_long)>,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)&fun,(anon_class_32_1_3a3b9956 *)&local_48);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_c8,&fun);
  ::std::__cxx11::string::string((string *)&sStack_e8,(string *)description);
  pOVar1 = add_option(this,&local_a8,&local_c8,&sStack_e8,false);
  ::std::__cxx11::string::~string((string *)&sStack_e8);
  std::_Function_base::~_Function_base(&local_c8.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_a8);
  if ((pOVar1->pname_)._M_string_length == 0) {
    pOVar1->type_size_ = 0;
    (pOVar1->super_OptionBase<CLI::Option>).required_ = false;
    std::_Function_base::~_Function_base(&fun.super__Function_base);
    return pOVar1;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_68,(string *)name);
  IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_68);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

Option *add_flag_function(std::string name,
                              std::function<void(size_t)> function, ///< A function to call, void(size_t)
                              std::string description = "") {

        CLI::callback_t fun = [function](CLI::results_t res) {
            auto count = static_cast<size_t>(res.size());
            function(count);
            return true;
        };

        Option *opt = add_option(name, fun, description, false);
        if(opt->get_positional())
            throw IncorrectConstruction::PositionalFlag(name);
        opt->type_size(0);
        return opt;
    }